

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse4.c
# Opt level: O3

void av1_round_shift_array_sse4_1(int32_t *arr,int size,int bit)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  __m128i round;
  undefined1 auVar9 [16];
  
  uVar8 = size >> 2;
  if (bit < 1) {
    if (0 < (int)uVar8) {
      lVar7 = 0;
      do {
        piVar1 = (int *)((long)arr + lVar7);
        iVar6 = piVar1[1];
        iVar3 = piVar1[2];
        iVar4 = piVar1[3];
        piVar2 = (int *)((long)arr + lVar7);
        *piVar2 = *piVar1 << -bit;
        piVar2[1] = iVar6;
        piVar2[2] = iVar3;
        piVar2[3] = iVar4;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)uVar8 << 4 != lVar7);
    }
  }
  else if (0 < (int)uVar8) {
    iVar6 = 1 << ((char)bit - 1U & 0x1f);
    lVar7 = 0;
    auVar9 = ZEXT416((uint)bit);
    do {
      piVar1 = (int *)((long)arr + lVar7);
      iVar3 = piVar1[1];
      iVar4 = piVar1[2];
      iVar5 = piVar1[3];
      piVar2 = (int *)((long)arr + lVar7);
      *piVar2 = *piVar1 + iVar6 >> auVar9;
      piVar2[1] = iVar3 + iVar6 >> auVar9;
      piVar2[2] = iVar4 + iVar6 >> auVar9;
      piVar2[3] = iVar5 + iVar6 >> auVar9;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar8 << 4 != lVar7);
  }
  return;
}

Assistant:

void av1_round_shift_array_sse4_1(int32_t *arr, int size, int bit) {
  __m128i *const vec = (__m128i *)arr;
  const int vec_size = size >> 2;
  av1_round_shift_array_32_sse4_1(vec, vec, vec_size, bit);
}